

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic.hpp
# Opt level: O1

long duckdb::GetInternalCValue<long,duckdb::TryCast>(duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  long lVar2;
  
  bVar1 = CanFetchValue(result,col,row);
  if (bVar1) {
    switch(result->deprecated_columns[col].deprecated_type) {
    case DUCKDB_TYPE_BOOLEAN:
      lVar2 = TryCastCInternal<bool,long,duckdb::TryCast>(result,col,row);
      return lVar2;
    case DUCKDB_TYPE_TINYINT:
      lVar2 = TryCastCInternal<signed_char,long,duckdb::TryCast>(result,col,row);
      return lVar2;
    case DUCKDB_TYPE_SMALLINT:
      lVar2 = TryCastCInternal<short,long,duckdb::TryCast>(result,col,row);
      return lVar2;
    case DUCKDB_TYPE_INTEGER:
      lVar2 = TryCastCInternal<int,long,duckdb::TryCast>(result,col,row);
      return lVar2;
    case DUCKDB_TYPE_BIGINT:
      lVar2 = TryCastCInternal<long,long,duckdb::TryCast>(result,col,row);
      return lVar2;
    case DUCKDB_TYPE_UTINYINT:
      lVar2 = TryCastCInternal<unsigned_char,long,duckdb::TryCast>(result,col,row);
      return lVar2;
    case DUCKDB_TYPE_USMALLINT:
      lVar2 = TryCastCInternal<unsigned_short,long,duckdb::TryCast>(result,col,row);
      return lVar2;
    case DUCKDB_TYPE_UINTEGER:
      lVar2 = TryCastCInternal<unsigned_int,long,duckdb::TryCast>(result,col,row);
      return lVar2;
    case DUCKDB_TYPE_UBIGINT:
      lVar2 = TryCastCInternal<unsigned_long,long,duckdb::TryCast>(result,col,row);
      return lVar2;
    case DUCKDB_TYPE_FLOAT:
      lVar2 = TryCastCInternal<float,long,duckdb::TryCast>(result,col,row);
      return lVar2;
    case DUCKDB_TYPE_DOUBLE:
      lVar2 = TryCastCInternal<double,long,duckdb::TryCast>(result,col,row);
      return lVar2;
    case DUCKDB_TYPE_TIMESTAMP:
      lVar2 = TryCastCInternal<duckdb::timestamp_t,long,duckdb::TryCast>(result,col,row);
      return lVar2;
    case DUCKDB_TYPE_DATE:
      lVar2 = TryCastCInternal<duckdb::date_t,long,duckdb::TryCast>(result,col,row);
      return lVar2;
    case DUCKDB_TYPE_TIME:
      lVar2 = TryCastCInternal<duckdb::dtime_t,long,duckdb::TryCast>(result,col,row);
      return lVar2;
    case DUCKDB_TYPE_INTERVAL:
      lVar2 = TryCastCInternal<duckdb::interval_t,long,duckdb::TryCast>(result,col,row);
      return lVar2;
    case DUCKDB_TYPE_HUGEINT:
      lVar2 = TryCastCInternal<duckdb::hugeint_t,long,duckdb::TryCast>(result,col,row);
      return lVar2;
    case DUCKDB_TYPE_VARCHAR:
      lVar2 = TryCastCInternal<char*,long,duckdb::FromCStringCastWrapper<duckdb::TryCast>>
                        (result,col,row);
      return lVar2;
    case DUCKDB_TYPE_DECIMAL:
      lVar2 = TryCastDecimalCInternal<long>(result,col,row);
      return lVar2;
    case DUCKDB_TYPE_UHUGEINT:
      lVar2 = TryCastCInternal<duckdb::uhugeint_t,long,duckdb::TryCast>(result,col,row);
      return lVar2;
    }
  }
  return 0;
}

Assistant:

RESULT_TYPE GetInternalCValue(duckdb_result *result, idx_t col, idx_t row) {
	if (!CanFetchValue(result, col, row)) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	switch (result->deprecated_columns[col].deprecated_type) {
	case DUCKDB_TYPE_BOOLEAN:
		return TryCastCInternal<bool, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TINYINT:
		return TryCastCInternal<int8_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_SMALLINT:
		return TryCastCInternal<int16_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_INTEGER:
		return TryCastCInternal<int32_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_BIGINT:
		return TryCastCInternal<int64_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UTINYINT:
		return TryCastCInternal<uint8_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_USMALLINT:
		return TryCastCInternal<uint16_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UINTEGER:
		return TryCastCInternal<uint32_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UBIGINT:
		return TryCastCInternal<uint64_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_FLOAT:
		return TryCastCInternal<float, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DOUBLE:
		return TryCastCInternal<double, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DATE:
		return TryCastCInternal<date_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TIME:
		return TryCastCInternal<dtime_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TIMESTAMP:
		return TryCastCInternal<timestamp_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_HUGEINT:
		return TryCastCInternal<hugeint_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UHUGEINT:
		return TryCastCInternal<uhugeint_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DECIMAL:
		return TryCastDecimalCInternal<RESULT_TYPE>(result, col, row);
	case DUCKDB_TYPE_INTERVAL:
		return TryCastCInternal<interval_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_VARCHAR:
		return TryCastCInternal<char *, RESULT_TYPE, FromCStringCastWrapper<OP>>(result, col, row);
	case DUCKDB_TYPE_BLOB:
		return TryCastCInternal<duckdb_blob, RESULT_TYPE, FromCBlobCastWrapper>(result, col, row);
	default: { // LCOV_EXCL_START
		// Invalid type for C to C++ conversion. Internally, we set the null mask to NULL.
		// This is a deprecated code path. Use the Vector Interface for nested and complex types.
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	} // LCOV_EXCL_STOP
	}
}